

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O0

shared_ptr<QPDFObject> __thiscall
QPDFObject::create<QPDF_InlineImage,std::__cxx11::string&>
          (QPDFObject *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<QPDFObject> sVar1;
  string local_58;
  QPDF_InlineImage local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  
  local_18 = args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::__cxx11::string::string((string *)&local_58,(string *)args);
  QPDF_InlineImage::QPDF_InlineImage(&local_38,&local_58);
  std::make_shared<QPDFObject,QPDF_InlineImage>((QPDF_InlineImage *)this);
  QPDF_InlineImage::~QPDF_InlineImage(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<QPDFObject>)sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<QPDFObject>
QPDFObject::create(Args&&... args)
{
    return std::make_shared<QPDFObject>(std::forward<T>(T(std::forward<Args>(args)...)));
}